

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O2

string * __thiscall
tinyusdz::crate::GetCrateDataTypeName_abi_cxx11_
          (string *__return_storage_ptr__,crate *this,int32_t type_id)

{
  value_type *pvVar1;
  char *pcVar2;
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  allocator local_39;
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  GetCrateDataType_abi_cxx11_(&local_38,this,type_id);
  if (local_38.contained.
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == false) {
    pcVar2 = "[Invalid]";
  }
  else {
    pvVar1 = nonstd::expected_lite::
             expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&local_38);
    pcVar2 = pvVar1->name;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_39);
  nonstd::expected_lite::
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCrateDataTypeName(int32_t type_id) {
  auto tyRet = GetCrateDataType(type_id);
  if (!tyRet) {
    return "[Invalid]";
  }

  const CrateDataType dty = tyRet.value();
  return dty.name;
}